

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

bool __thiscall Assimp::ColladaParser::ReadBoolFromTextContent(ColladaParser *this)

{
  int iVar1;
  char *__s1;
  bool bVar2;
  
  __s1 = GetTextContent(this);
  if (__s1 != (char *)0x0) {
    iVar1 = strncasecmp(__s1,"true",4);
    if (iVar1 == 0) {
      bVar2 = true;
    }
    else {
      bVar2 = *__s1 != '0';
    }
    return bVar2;
  }
  __assert_fail("__null != s1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/StringComparison.h"
                ,0xbf,"int Assimp::ASSIMP_strincmp(const char *, const char *, unsigned int)");
}

Assistant:

bool ColladaParser::ReadBoolFromTextContent()
{
    const char* cur = GetTextContent();
    return (!ASSIMP_strincmp(cur, "true", 4) || '0' != *cur);
}